

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

string * vera::toString<int>(string *__return_storage_ptr__,int *_value,int _precision,int _width,
                            char _fill)

{
  long lVar1;
  ostream *this;
  undefined3 in_register_00000081;
  ostringstream out;
  long local_1a8 [3];
  uint auStack_190 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xfffffefb | 4;
  this = std::operator<<(local_1a8,CONCAT31(in_register_00000081,_fill));
  lVar1 = *(long *)this;
  *(long *)(this + *(long *)(lVar1 + -0x18) + 0x10) = (long)_width;
  *(long *)(this + *(long *)(lVar1 + -0x18) + 8) = (long)_precision;
  std::ostream::operator<<(this,*_value);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const T& _value, int _precision, int _width, char _fill) {
    std::ostringstream out;
    out << std::fixed << std::setfill(_fill) << std::setw(_width) << std::setprecision(_precision) << _value;
    return out.str();
}